

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

void pierce_outer_wall(chunk_conflict *c,loc_conflict grid)

{
  wchar_t wVar1;
  loc *plVar2;
  bool bVar3;
  dun_data *pdVar4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  loc grid_00;
  
  pdVar4 = dun;
  wVar1 = dun->wall_n;
  wVar6 = grid.x;
  wVar8 = grid.y;
  if (wVar1 < (int)(uint)z_info->wall_pierce_max) {
    plVar2 = dun->wall;
    plVar2[wVar1].x = wVar6;
    plVar2[wVar1].y = wVar8;
    pdVar4->wall_n = pdVar4->wall_n + L'\x01';
  }
  wVar7 = wVar6 + L'\xffffffff';
  wVar1 = wVar8 + L'\xffffffff';
  do {
    if (wVar7 != L'\0' && wVar1 != L'\0') {
      grid_00.y = wVar1;
      grid_00.x = wVar7;
      _Var5 = square_in_bounds(c,grid_00);
      if ((_Var5) && (_Var5 = square_is_granite_with_flag(c,(loc_conflict)grid_00,L'\f'), _Var5)) {
        set_marked_granite((chunk *)c,(loc_conflict)grid_00,L'\r');
      }
    }
    bVar3 = wVar7 <= wVar6;
    wVar7 = wVar7 + L'\x01';
  } while ((bVar3) ||
          (bVar3 = wVar1 <= wVar8, wVar7 = wVar6 + L'\xffffffff', wVar1 = wVar1 + L'\x01', bVar3));
  return;
}

Assistant:

static void pierce_outer_wall(struct chunk *c, struct loc grid)
{
	struct loc adj;

	/* Save the wall location */
	if (dun->wall_n < z_info->wall_pierce_max) {
		dun->wall[dun->wall_n] = grid;
		dun->wall_n++;
	}

	/* Forbid re-entry near this piercing */
	for (adj.y = grid.y - 1; adj.y <= grid.y + 1; adj.y++) {
		for (adj.x = grid.x - 1; adj.x <= grid.x + 1; adj.x++) {
			if (adj.x != 0 && adj.y != 0 &&
					square_in_bounds(c, adj) &&
					square_is_granite_with_flag(c, adj,
					SQUARE_WALL_OUTER)) {
				set_marked_granite(c, adj, SQUARE_WALL_SOLID);
			}
		}
	}
}